

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 13_array_object.cpp
# Opt level: O3

double output_array(array<double,_4UL> s)

{
  double dVar1;
  ostream *poVar2;
  long lVar3;
  double local_40;
  
  local_40 = 0.0;
  lVar3 = 0;
  do {
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,
                        *(char **)((long)&SEASONS_abi_cxx11_._M_elems[0]._M_dataplus._M_p +
                                  lVar3 * 4),
                        *(long *)((long)&SEASONS_abi_cxx11_._M_elems[0]._M_string_length + lVar3 * 4
                                 ));
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," : ",3);
    dVar1 = *(double *)(&stack0x00000008 + lVar3);
    poVar2 = std::ostream::_M_insert<double>(dVar1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    local_40 = local_40 + dVar1;
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x20);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Total spend: ",0xd);
  poVar2 = std::ostream::_M_insert<double>(local_40);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  return local_40;
}

Assistant:

double output_array(std::array<double, SEASON_COUNT> s) {
    double total = 0;
    for(int i = 0; i < SEASON_COUNT; i++) {
        std::cout << SEASONS[i] << " : " << s[i] << std::endl;
        total += s[i];
    }
    std::cout << "Total spend: " << total << std::endl;
    return total;
}